

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_link_resolver.c
# Opt level: O0

void test_linkify_old_cpio(void)

{
  archive_entry_linkresolver *res;
  la_int64_t lVar1;
  char *pcVar2;
  archive_entry_linkresolver *resolver;
  archive_entry *e2;
  archive_entry *entry;
  
  res = archive_entry_linkresolver_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'b',(uint)(res != (archive_entry_linkresolver *)0x0),
                   "NULL != (resolver = archive_entry_linkresolver_new())",(void *)0x0);
  archive_entry_linkresolver_set_strategy(res,0x10001);
  e2 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'g',(uint)(e2 != (archive_entry *)0x0),"NULL != (entry = archive_entry_new())",
                   (void *)0x0);
  archive_entry_set_pathname(e2,"test1");
  archive_entry_set_ino(e2,1);
  archive_entry_set_dev(e2,2);
  archive_entry_set_nlink(e2,2);
  archive_entry_set_size(e2,10);
  archive_entry_linkify(res,&e2,(archive_entry **)&resolver);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'p',(uint)(resolver == (archive_entry_linkresolver *)0x0),"e2 == NULL",
                   (void *)0x0);
  lVar1 = archive_entry_size(e2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_link_resolver.c"
                      ,L'q',10,"10",lVar1,"archive_entry_size(entry)",(void *)0x0);
  pcVar2 = archive_entry_pathname(e2);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L'r',"test1","\"test1\"",pcVar2,"archive_entry_pathname(entry)",(void *)0x0,L'\0');
  archive_entry_linkify(res,&e2,(archive_entry **)&resolver);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_link_resolver.c"
                   ,L'v',(uint)(resolver == (archive_entry_linkresolver *)0x0),"e2 == NULL",
                   (void *)0x0);
  pcVar2 = archive_entry_pathname(e2);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L'w',"test1","\"test1\"",pcVar2,"archive_entry_pathname(entry)",(void *)0x0,L'\0');
  pcVar2 = archive_entry_hardlink(e2);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_link_resolver.c"
             ,L'x',(char *)0x0,"NULL",pcVar2,"archive_entry_hardlink(entry)",(void *)0x0,L'\0');
  lVar1 = archive_entry_size(e2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_link_resolver.c"
                      ,L'y',10,"10",lVar1,"archive_entry_size(entry)",(void *)0x0);
  archive_entry_free(e2);
  archive_entry_linkresolver_free(res);
  return;
}

Assistant:

static void test_linkify_old_cpio(void)
{
	struct archive_entry *entry, *e2;
	struct archive_entry_linkresolver *resolver;

	/* Initialize the resolver. */
	assert(NULL != (resolver = archive_entry_linkresolver_new()));
	archive_entry_linkresolver_set_strategy(resolver,
	    ARCHIVE_FORMAT_CPIO_POSIX);

	/* Create an entry with 2 link and try to linkify it. */
	assert(NULL != (entry = archive_entry_new()));
	archive_entry_set_pathname(entry, "test1");
	archive_entry_set_ino(entry, 1);
	archive_entry_set_dev(entry, 2);
	archive_entry_set_nlink(entry, 2);
	archive_entry_set_size(entry, 10);
	archive_entry_linkify(resolver, &entry, &e2);

	/* Shouldn't have been changed. */
	assert(e2 == NULL);
	assertEqualInt(10, archive_entry_size(entry));
	assertEqualString("test1", archive_entry_pathname(entry));

	/* Still shouldn't be matched. */
	archive_entry_linkify(resolver, &entry, &e2);
	assert(e2 == NULL);
	assertEqualString("test1", archive_entry_pathname(entry));
	assertEqualString(NULL, archive_entry_hardlink(entry));
	assertEqualInt(10, archive_entry_size(entry));

	archive_entry_free(entry);
	archive_entry_linkresolver_free(resolver);
}